

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_2> tcu::reflect<double,2>(Vector<double,_2> *i,Vector<double,_2> *n)

{
  Vector<double,_2> *res_2;
  int i_1;
  long lVar1;
  undefined8 *in_RDI;
  double res;
  double dVar2;
  Vector<double,_2> VVar3;
  Vector<double,_2> res_1;
  
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + n->m_data[lVar1] * i->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    VVar3.m_data[1] = n->m_data[lVar1] * (dVar2 + dVar2);
    res_1.m_data[lVar1] = VVar3.m_data[1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  *in_RDI = 0;
  in_RDI[1] = 0;
  lVar1 = 0;
  do {
    VVar3.m_data[0] = i->m_data[lVar1] - res_1.m_data[lVar1];
    in_RDI[lVar1] = VVar3.m_data[0];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return (Vector<double,_2>)VVar3.m_data;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}